

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diner-demo.c
# Opt level: O1

int main(int argc,char **argv)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  dining_policy_t dVar4;
  char *__target_thread;
  fork_t *right;
  fork_t *left;
  fork_t *pfVar5;
  diner_t *pdVar6;
  uint uVar7;
  char cVar8;
  int id1;
  ulong uVar9;
  int i;
  long lVar10;
  int i_1;
  ulong uVar11;
  sched_param sched_parameters;
  Configuration config;
  diner_t diner [5];
  fork_t fork [5];
  undefined1 local_1e8 [12];
  sched_param local_1dc;
  fork_t *local_1d8;
  ulong uStack_1d0;
  diner_t local_1c8 [5];
  fork_t local_128 [5];
  
  pdVar6 = (diner_t *)local_1e8;
  local_1d8 = (fork_t *)0x200000005;
  uStack_1d0 = 3;
  parseCommandLine(argc,argv,(Configuration *)&local_1d8);
  printf("Number of Philosophers: %d\n",(ulong)local_1d8 & 0xffffffff);
  printf("Think Time: %d seconds\n",(ulong)local_1d8 >> 0x20);
  printf("Eat Time: %d seconds\n",uStack_1d0 & 0xffffffff);
  printf("Enumerate Resources: %s\n");
  __target_thread = (char *)pthread_self();
  local_1dc.__sched_priority = sched_get_priority_max(0);
  cVar8 = '\0';
  iVar3 = pthread_setschedparam((pthread_t)__target_thread,0,&local_1dc);
  if (iVar3 == 0) {
    pfVar5 = (fork_t *)(local_1c8 + 5);
    lVar10 = 0;
    do {
      fork_init(pfVar5,(int)lVar10);
      lVar10 = lVar10 + 1;
      pfVar5 = pfVar5 + 1;
    } while (lVar10 != 5);
    pfVar5 = (fork_t *)(local_1c8 + 5);
    uVar11 = 0;
    do {
      pdVar6 = pdVar6 + 1;
      uVar1 = uVar11 + 1;
      uVar7 = (uint)uVar1;
      if (uVar11 == 4) {
        uVar7 = 0;
      }
      dVar4 = get_dining_policy();
      uVar9 = (ulong)uVar7;
      if (uVar9 < uVar11 && dVar4 == FORK_REORDERING) {
        printf("Reordered forks %d and %d\n",uVar11 & 0xffffffff,(ulong)uVar7);
        right = pfVar5;
        left = (fork_t *)((long)local_1c8 + uVar9 * 0x30 + 0xa0);
      }
      else {
        right = (fork_t *)((long)local_1c8 + uVar9 * 0x30 + 0xa0);
        left = pfVar5;
      }
      diner_init(pdVar6,(int)uVar11,left,right);
      pfVar5 = pfVar5 + 1;
      uVar11 = uVar1;
    } while (uVar1 != 5);
    pdVar6 = local_1c8;
    uVar11 = 0;
    do {
      printf("Creating thread %d",uVar11 & 0xffffffff);
      diner_start(pdVar6);
      uVar11 = uVar11 + 1;
      pdVar6 = pdVar6 + 1;
    } while (uVar11 != 5);
    lVar10 = 0;
    do {
      do {
        putchar((int)local_1c8[lVar10].state);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 5);
      putchar(10);
      bVar2 = false;
      lVar10 = 1;
      do {
        bVar2 = (bool)(bVar2 | (&local_1c8[0].id)[lVar10] != 'd');
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0xa1);
      millisecond_sleep(0x33);
      lVar10 = 0;
    } while (bVar2);
    lVar10 = 0;
    do {
      diner_await((diner_t *)(&local_1c8[0].id + lVar10));
      printf("Diner id %c exited normally; state = %c\n",
             (ulong)(uint)(int)((diner_t *)(&local_1c8[0].id + lVar10))->id,
             (ulong)(uint)(int)(&local_1c8[0].state)[lVar10]);
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0xa0);
    lVar10 = 0;
    do {
      fork_free_resources((fork_t *)(&local_1c8[5].id + lVar10));
      lVar10 = lVar10 + 0x30;
    } while (lVar10 != 0xf0);
    return 0;
  }
  main_cold_1();
  *__target_thread = cVar8 + '0';
  iVar3 = pthread_mutex_init((pthread_mutex_t *)(__target_thread + 8),(pthread_mutexattr_t *)0x0);
  return iVar3;
}

Assistant:

int main(int argc, char **argv) {
    Configuration config = {
        .num_philosophers = 5,      // default number of philosophers
        .think_time = 2,            // default think time in seconds
        .eat_time = 3,              // default eat time in seconds
        .enumerate_resources = 0    // default for resource enumeration: off
    };

    parseCommandLine(argc, argv, &config);

    printf("Number of Philosophers: %d\n", config.num_philosophers);
    printf("Think Time: %d seconds\n", config.think_time);
    printf("Eat Time: %d seconds\n", config.eat_time);
    printf("Enumerate Resources: %s\n", config.enumerate_resources ? "Yes" : "No");

    fork_t fork[MAX_DINERS];
    diner_t diner[MAX_DINERS];

    /* The main thread  */
    pthread_t this_thread = pthread_self();
    struct sched_param sched_parameters;
    sched_parameters.sched_priority = sched_get_priority_max(SCHED_OTHER);
    int status = pthread_setschedparam(this_thread, SCHED_OTHER, &sched_parameters);

    // the main thread monitors the state of the diners and runs at highest
    // priority so it can continue doing something, even if (or when) the other
    // threads get deadlocked.

    if (status != 0)
    {
        fprintf(stderr, "Cannot set main thread max prioirty. Fatal.\n");
        exit(1);
    }

    /* initialize the shared resources (forks) */
    for (int i = 0; i < MAX_DINERS; i++)
        fork_init(&fork[i], i);

    /* initialize the diners to link to the shared resources (forks) */
    for (int i = 0; i < MAX_DINERS; i++)
    {
        int id1 = i;
        int id2 = (i + 1) % MAX_DINERS;
        if (get_dining_policy() == FORK_REORDERING && id1 > id2)
        {
            printf("Reordered forks %d and %d\n", id1, id2);
            diner_init(&diner[i], i, &fork[id2], &fork[id1]);
        }
        else
        {
            diner_init(&diner[i], i, &fork[id1], &fork[id2]);
        }
    }

    /* start the actual threads for each diner */
    for (int i = 0; i < MAX_DINERS; i++)
    {
        printf("Creating thread %d", i);
        diner_start(&diner[i]);
    }

    /* monitor the state of the diners in the main (highest-priority) thread
     * because it is high priority, it must sleep for a short time to give
     * the diner threads a chance to do their thing.
     */
    int go_on = 1;
    while (go_on)
    {
        for (int i = 0; i < MAX_DINERS; i++)
        {
            putchar(diner[i].state);
        }
        putchar('\n');
        go_on = 0;
        for (int i = 0; i < MAX_DINERS; i++)
        {
            go_on |= diner[i].state != 'd';
        }
        millisecond_sleep(MAIN_THREAD_SLEEP_TIME);
    }

    /* assuming no deadlock happened, this code will be reached so we
     * can join with the main thread
     */

    for (int i=0; i < MAX_DINERS; i++)
    {
        diner_await(&diner[i]);
        printf("Diner id %c exited normally; state = %c\n", diner[i].id, diner[i].state);
    }

    /* locks associated with forks need to be cleaned up */
    for (int i = 0; i < MAX_DINERS; i++)
        fork_free_resources(&fork[i]);

    /* attribute object should also be freed (could do earlier, too) */
    //pthread_attr_destroy(&attr);
}